

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O2

FunctionDefinition * __thiscall
stackjit::ClassMetadata::getVirtualFunctionRootDefinition
          (ClassMetadata *this,FunctionDefinition *funcDef)

{
  pointer ppFVar1;
  FunctionDefinition *this_00;
  __type _Var2;
  bool bVar3;
  ClassMetadata *pCVar4;
  string *__lhs;
  string *__rhs;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list1;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list2;
  pointer ppFVar5;
  
LAB_00177219:
  if (this->mParentClass == (ClassType *)0x0) {
    return funcDef;
  }
  pCVar4 = ClassType::metadata(this->mParentClass);
  ppFVar5 = (pCVar4->mVirtualFunctions).
            super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (pCVar4->mVirtualFunctions).
            super__Vector_base<const_stackjit::FunctionDefinition_*,_std::allocator<const_stackjit::FunctionDefinition_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppFVar5 == ppFVar1) {
      return funcDef;
    }
    this_00 = *ppFVar5;
    __lhs = FunctionDefinition::memberName_abi_cxx11_(funcDef);
    __rhs = FunctionDefinition::memberName_abi_cxx11_(this_00);
    _Var2 = std::operator==(__lhs,__rhs);
    if (_Var2) {
      list1 = FunctionDefinition::callParameters(funcDef);
      list2 = FunctionDefinition::callParameters(this_00);
      bVar3 = TypeSystem::areEqual(list1,list2);
      if (bVar3) break;
    }
    ppFVar5 = ppFVar5 + 1;
  } while( true );
  this = ClassType::metadata(this->mParentClass);
  funcDef = this_00;
  goto LAB_00177219;
}

Assistant:

const FunctionDefinition* ClassMetadata::getVirtualFunctionRootDefinition(const FunctionDefinition* funcDef) const {
		if (mParentClass != nullptr) {
			for (auto parentDef : mParentClass->metadata()->mVirtualFunctions) {
				if (funcDef->memberName() == parentDef->memberName()
					&& TypeSystem::areEqual(funcDef->callParameters(), parentDef->callParameters())) {
					return mParentClass->metadata()->getVirtualFunctionRootDefinition(parentDef);
				}
			}
		}

		return funcDef;
	}